

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

Abc_Obj_t * Gia_ManInsertOne_rec(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNew_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pObj == (Abc_Obj_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)Abc_NtkCreateNodeConst0(pNtk);
  }
  else {
    pAVar2 = Abc_ObjNtk(pObj);
    if (pAVar2 != pNew) {
      __assert_fail("Abc_ObjNtk(pObj) == pNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                    ,0x1ed,"Abc_Obj_t *Gia_ManInsertOne_rec(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Obj_t *)")
      ;
    }
    if ((pObj->field_6).pTemp == (void *)0x0) {
      for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar3 = Abc_ObjFanin(pObj,local_34);
        Gia_ManInsertOne_rec(pNtk,pNew,pAVar3);
      }
      pAVar3 = Abc_NtkDupObj(pNtk,pObj,0);
      (pObj->field_6).pCopy = pAVar3;
      for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar3 = Abc_ObjFanin(pObj,local_34);
        Abc_ObjAddFanin(pObj,pAVar3);
      }
      pNtk_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
    }
    else {
      pNtk_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
    }
  }
  return (Abc_Obj_t *)pNtk_local;
}

Assistant:

Abc_Obj_t * Gia_ManInsertOne_rec( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;  int i;
    if ( pObj == NULL )
        return Abc_NtkCreateNodeConst0( pNtk );
    assert( Abc_ObjNtk(pObj) == pNew );
    if ( pObj->pCopy )
        return pObj->pCopy;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Gia_ManInsertOne_rec( pNtk, pNew, pFanin );
    pObj->pCopy = Abc_NtkDupObj( pNtk, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj, pFanin );
    return pObj->pCopy;
}